

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void qt_from_latin1(char16_t *dst,char *str,size_t size)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_class_16_2_441918f5_for_code code;
  ulong in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  __m128i unpacked2_1;
  __m128i unpacked1_1;
  __m128i chunk2;
  __m128i chunk1;
  __m128i unpacked2;
  __m128i unpacked1;
  qptrdiff offset;
  char *e;
  __m128i nullMask;
  size_t size_2;
  size_t size_1;
  __m128i data_1;
  __m128i *dataptr_1;
  __m128i data;
  __m128i *dataptr;
  uint dest_1;
  uint dest;
  anon_class_48_3_c09ef4c2 processOneChunk;
  undefined8 local_2e8;
  undefined1 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd21;
  undefined1 in_stack_fffffffffffffd22;
  undefined1 in_stack_fffffffffffffd23;
  undefined1 in_stack_fffffffffffffd24;
  undefined1 in_stack_fffffffffffffd25;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  undefined1 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd29;
  undefined1 in_stack_fffffffffffffd2a;
  undefined1 in_stack_fffffffffffffd2b;
  undefined1 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  qptrdiff local_288;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  byte bStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  byte bStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  byte local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  byte local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  anon_class_48_3_c09ef4c2 local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0xaa,0x30);
  local_38.nullMask[0] = 0;
  local_38.nullMask[1] = 0;
  if (in_RDX < 0x10) {
    if (in_RDX < 4) {
      code.dst._1_1_ = in_stack_fffffffffffffd21;
      code.dst._0_1_ = in_stack_fffffffffffffd20;
      code.dst._2_1_ = in_stack_fffffffffffffd22;
      code.dst._3_1_ = in_stack_fffffffffffffd23;
      code.dst._4_1_ = in_stack_fffffffffffffd24;
      code.dst._5_1_ = in_stack_fffffffffffffd25;
      code.dst._6_1_ = in_stack_fffffffffffffd26;
      code.dst._7_1_ = in_stack_fffffffffffffd27;
      code.str._0_1_ = in_stack_fffffffffffffd28;
      code.str._1_1_ = in_stack_fffffffffffffd29;
      code.str._2_1_ = in_stack_fffffffffffffd2a;
      code.str._3_1_ = in_stack_fffffffffffffd2b;
      code.str._4_1_ = in_stack_fffffffffffffd2c;
      code.str._5_1_ = in_stack_fffffffffffffd2d;
      code.str._6_1_ = in_stack_fffffffffffffd2e;
      code.str._7_1_ = in_stack_fffffffffffffd2f;
      (anonymous_namespace)::UnrollTailLoop<3u>::
      exec<qt_from_latin1(char16_t*,char_const*,unsigned_long)::__1,long_long>
                ((longlong)in_RDI,code);
    }
    else if (in_RDX < 8) {
      uVar2 = *(undefined4 *)in_RSI;
      uVar3 = *(undefined4 *)((long)in_RSI + (in_RDX - 4));
      local_88 = (byte)uVar2;
      uStack_87 = (undefined1)((uint)uVar2 >> 8);
      uStack_86 = (undefined1)((uint)uVar2 >> 0x10);
      uStack_85 = (undefined1)((uint)uVar2 >> 0x18);
      local_a8 = (byte)uVar3;
      uStack_a7 = (undefined1)((uint)uVar3 >> 8);
      uStack_a6 = (undefined1)((uint)uVar3 >> 0x10);
      uStack_a5 = (undefined1)((uint)uVar3 >> 0x18);
      local_2e8._0_4_ = (uint)CONCAT12(uStack_a7,(ushort)local_a8);
      local_2e8._0_6_ = (uint6)CONCAT14(uStack_a6,(uint)local_2e8);
      local_2e8 = (ulong)CONCAT16(uStack_a5,(uint6)local_2e8);
      *in_RDI = (ulong)CONCAT16(uStack_85,
                                (uint6)CONCAT14(uStack_86,(uint)CONCAT12(uStack_87,(ushort)local_88)
                                               ));
      *(ulong *)((long)in_RDI + in_RDX * 2 + -8) = local_2e8;
    }
    else {
      uVar1 = *in_RSI;
      uStack_e7 = (undefined1)((ulong)uVar1 >> 8);
      uStack_e6 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_e5 = (undefined1)((ulong)uVar1 >> 0x18);
      bStack_e4 = (byte)((ulong)uVar1 >> 0x20);
      uStack_e3 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_e2 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_e1 = (undefined1)((ulong)uVar1 >> 0x38);
      local_298._0_4_ = (uint)CONCAT12(uStack_e7,(ushort)(byte)uVar1);
      local_298._0_6_ = (uint6)CONCAT14(uStack_e6,(uint)local_298);
      local_298 = (ulong)CONCAT16(uStack_e5,(uint6)local_298);
      uStack_290._0_4_ = (uint)CONCAT12(uStack_e3,(ushort)bStack_e4);
      uStack_290._0_6_ = (uint6)CONCAT14(uStack_e2,(uint)uStack_290);
      uStack_290 = (ulong)CONCAT16(uStack_e1,(uint6)uStack_290);
      uVar1 = *(undefined8 *)((long)in_RSI + (in_RDX - 8));
      uStack_c7 = (undefined1)((ulong)uVar1 >> 8);
      uStack_c6 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_c5 = (undefined1)((ulong)uVar1 >> 0x18);
      bStack_c4 = (byte)((ulong)uVar1 >> 0x20);
      uStack_c3 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_c2 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_c1 = (undefined1)((ulong)uVar1 >> 0x38);
      local_2a8._0_4_ = (uint)CONCAT12(uStack_c7,(ushort)(byte)uVar1);
      local_2a8._0_6_ = (uint6)CONCAT14(uStack_c6,(uint)local_2a8);
      local_2a8 = (ulong)CONCAT16(uStack_c5,(uint6)local_2a8);
      uStack_2a0._0_4_ = (uint)CONCAT12(uStack_c3,(ushort)bStack_c4);
      uStack_2a0._0_6_ = (uint6)CONCAT14(uStack_c2,(uint)uStack_2a0);
      uStack_2a0 = (ulong)CONCAT16(uStack_c1,(uint6)uStack_2a0);
      *in_RDI = local_298;
      in_RDI[1] = uStack_290;
      *(ulong *)((long)in_RDI + in_RDX * 2 + -0x10) = local_2a8;
      *(ulong *)((long)in_RDI + in_RDX * 2 + -8) = uStack_2a0;
    }
  }
  else {
    for (local_288 = 0; (ulong)((long)in_RSI + local_288 + 0x10) <= (long)in_RSI + in_RDX;
        local_288 = local_288 + 0x10) {
      qt_from_latin1::anon_class_48_3_c09ef4c2::operator()(&local_38,local_288);
    }
    if ((ulong)((long)in_RSI + local_288) < (long)in_RSI + in_RDX) {
      qt_from_latin1::anon_class_48_3_c09ef4c2::operator()(&local_38,in_RDX - 0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_CORE_EXPORT void qt_from_latin1(char16_t *dst, const char *str, size_t size) noexcept
{
    /* SIMD:
     * Unpacking with SSE has been shown to improve performance on recent CPUs
     * The same method gives no improvement with NEON. On Aarch64, clang will do the vectorization
     * itself in exactly the same way as one would do it with intrinsics.
     */
#if defined(__SSE2__)
    // we're going to read str[offset..offset+15] (16 bytes)
    const __m128i nullMask = _mm_setzero_si128();
    auto processOneChunk = [=](qptrdiff offset) {
        const __m128i chunk = _mm_loadu_si128((const __m128i*)(str + offset)); // load
        if constexpr (UseAvx2) {
            // zero extend to an YMM register
            const __m256i extended = _mm256_cvtepu8_epi16(chunk);

            // store
            _mm256_storeu_si256((__m256i*)(dst + offset), extended);
        } else {
            // unpack the first 8 bytes, padding with zeros
            const __m128i firstHalf = _mm_unpacklo_epi8(chunk, nullMask);
            _mm_storeu_si128((__m128i*)(dst + offset), firstHalf); // store

            // unpack the last 8 bytes, padding with zeros
            const __m128i secondHalf = _mm_unpackhi_epi8 (chunk, nullMask);
            _mm_storeu_si128((__m128i*)(dst + offset + 8), secondHalf); // store
        }
    };

    const char *e = str + size;
    if (size >= sizeof(__m128i)) {
        qptrdiff offset = 0;
        for ( ; str + offset + sizeof(__m128i) <= e; offset += sizeof(__m128i))
            processOneChunk(offset);
        if (str + offset < e)
            processOneChunk(size - sizeof(__m128i));
        return;
    }

#  if !defined(__OPTIMIZE_SIZE__)
    if (size >= 4) {
        // two overlapped loads & stores, of either 64-bit or of 32-bit
        if (size >= 8) {
            const __m128i unpacked1 = mm_load8_zero_extend(str);
            const __m128i unpacked2 = mm_load8_zero_extend(str + size - 8);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst), unpacked1);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + size -  8), unpacked2);
        } else {
            const __m128i chunk1 = _mm_cvtsi32_si128(qFromUnaligned<quint32>(str));
            const __m128i chunk2 = _mm_cvtsi32_si128(qFromUnaligned<quint32>(str + size - 4));
            const __m128i unpacked1 = _mm_unpacklo_epi8(chunk1, nullMask);
            const __m128i unpacked2 = _mm_unpacklo_epi8(chunk2, nullMask);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst), unpacked1);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst + size - 4), unpacked2);
        }
        return;
    } else {
        size = size % 4;
        return UnrollTailLoop<3>::exec(qsizetype(size), [=](qsizetype i) { dst[i] = uchar(str[i]); });
    }
#  endif
#endif
#if defined(__mips_dsp)
    static_assert(sizeof(qsizetype) == sizeof(int),
                  "oops, the assembler implementation needs to be called in a loop");
    if (size > 20)
        qt_fromlatin1_mips_asm_unroll8(dst, str, size);
    else
        qt_fromlatin1_mips_asm_unroll4(dst, str, size);
#else
    while (size--)
        *dst++ = (uchar)*str++;
#endif
}